

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pbVar1;
  string *psVar2;
  bool bVar3;
  size_type sVar4;
  char *pcVar5;
  ostream *poVar6;
  bool local_3eb;
  allocator local_331;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  ostringstream e;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableFeatures;
  char *features;
  undefined1 local_88 [8];
  string lang;
  allocator local_51;
  string local_50;
  string *local_30;
  string *error_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  local_30 = error;
  error_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  sVar4 = cmGeneratorExpression::Find(feature);
  psVar2 = feature_local;
  if (sVar4 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)local_88);
    bVar3 = CompileFeatureKnown(this,(cmTarget *)feature_local,error_local,(string *)local_88,
                                local_30);
    if (bVar3) {
      availableFeatures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CompileFeaturesAvailable(this,(string *)local_88,local_30);
      if (availableFeatures.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0);
        pbVar1 = availableFeatures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,(char *)pbVar1,&local_d1);
        cmSystemTools::ExpandListArgument
                  (&local_d0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0,false);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        local_e8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0);
        local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b0);
        local_e0 = std::
                   find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                             (local_e8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_f0,error_local);
        local_f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0);
        bVar3 = __gnu_cxx::operator==(&local_e0,&local_f8);
        psVar2 = feature_local;
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          poVar6 = std::operator<<((ostream *)local_270,"The compiler feature \"");
          poVar6 = std::operator<<(poVar6,(string *)error_local);
          poVar6 = std::operator<<(poVar6,"\" is not known to ");
          poVar6 = std::operator<<(poVar6,(string *)local_88);
          poVar6 = std::operator<<(poVar6," compiler\n\"");
          std::operator+(&local_2b0,"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          std::operator+(&local_290,&local_2b0,"_COMPILER_ID");
          pcVar5 = GetDefinition(this,&local_290);
          poVar6 = std::operator<<(poVar6,pcVar5);
          poVar6 = std::operator<<(poVar6,"\"\nversion ");
          std::operator+(&local_2f0,"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          std::operator+(&local_2d0,&local_2f0,"_COMPILER_VERSION");
          pcVar5 = GetDefinition(this,&local_2d0);
          poVar6 = std::operator<<(poVar6,pcVar5);
          std::operator<<(poVar6,".");
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_330,"COMPILE_FEATURES",&local_331);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmTarget::AppendProperty((cmTarget *)psVar2,&local_330,pcVar5,false);
          std::__cxx11::string::~string((string *)&local_330);
          std::allocator<char>::~allocator((allocator<char> *)&local_331);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"C");
          if (bVar3) {
            local_3eb = AddRequiredTargetCFeature(this,(cmTarget *)feature_local,error_local);
          }
          else {
            local_3eb = AddRequiredTargetCxxFeature(this,(cmTarget *)feature_local,error_local);
          }
          this_local._7_1_ = local_3eb;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b0);
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"COMPILE_FEATURES",&local_51);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmTarget::AppendProperty((cmTarget *)psVar2,&local_50,pcVar5,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::
AddRequiredTargetFeature(cmTarget *target, const std::string& feature,
                         std::string *error) const
{
  if (cmGeneratorExpression::Find(feature) != std::string::npos)
    {
    target->AppendProperty("COMPILE_FEATURES", feature.c_str());
    return true;
    }

  std::string lang;
  if (!this->CompileFeatureKnown(target, feature, lang, error))
    {
    return false;
    }

  const char* features = this->CompileFeaturesAvailable(lang, error);
  if (!features)
    {
    return false;
    }

  std::vector<std::string> availableFeatures;
  cmSystemTools::ExpandListArgument(features, availableFeatures);
  if (std::find(availableFeatures.begin(),
                availableFeatures.end(),
                feature) == availableFeatures.end())
    {
    std::ostringstream e;
    e << "The compiler feature \"" << feature
      << "\" is not known to " << lang << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  target->AppendProperty("COMPILE_FEATURES", feature.c_str());

  return lang == "C"
      ? this->AddRequiredTargetCFeature(target, feature)
      : this->AddRequiredTargetCxxFeature(target, feature);
}